

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# n2builder.cpp
# Opt level: O3

void icu_63::Normalizer2DataBuilder::computeDiff
               (Normalizer2DataBuilder *b1,Normalizer2DataBuilder *b2,Normalizer2DataBuilder *diff)

{
  uint8_t uVar1;
  UChar32 UVar2;
  UBool UVar3;
  bool bVar4;
  Norm *pNVar5;
  Norm *pNVar6;
  MappingType MVar7;
  UChar32 c;
  UnicodeString *s2;
  MappingType MVar8;
  UnicodeString *s1;
  UnicodeSetIterator mIter;
  UnicodeSetIterator ccIter;
  UnicodeSet mSet;
  UnicodeSet ccSet;
  UnicodeSetIterator local_160;
  UnicodeSetIterator local_120;
  UnicodeSet local_e0;
  UnicodeSet local_88;
  
  if (*(int *)b1->unicodeVersion != *(int *)b2->unicodeVersion) {
    *(int *)diff->unicodeVersion = *(int *)b1->unicodeVersion;
  }
  UnicodeSet::UnicodeSet(&local_88,(UnicodeSet *)b1);
  UnicodeSet::addAll(&local_88,(UnicodeSet *)b2);
  UnicodeSetIterator::UnicodeSetIterator(&local_120,&local_88);
  while( true ) {
    UVar3 = UnicodeSetIterator::next(&local_120);
    UVar2 = local_120.codepoint;
    if ((UVar3 == '\0') || (local_120.codepoint == -1)) break;
    pNVar5 = Norms::getNormRef(&b1->norms,local_120.codepoint);
    uVar1 = pNVar5->cc;
    pNVar5 = Norms::getNormRef(&b2->norms,UVar2);
    if (uVar1 != pNVar5->cc) {
      pNVar5 = Norms::createNorm(&diff->norms,UVar2);
      pNVar5->cc = uVar1;
      UnicodeSet::add((UnicodeSet *)diff,UVar2);
    }
  }
  UnicodeSet::UnicodeSet(&local_e0,&(b1->norms).mappingSet);
  UnicodeSet::addAll(&local_e0,&(b2->norms).mappingSet);
  UnicodeSetIterator::UnicodeSetIterator(&local_160,&local_e0);
LAB_001ded56:
  UVar3 = UnicodeSetIterator::next(&local_160);
  UVar2 = local_160.codepoint;
  if ((UVar3 == '\0') || (local_160.codepoint == -1)) {
    UnicodeSetIterator::~UnicodeSetIterator(&local_160);
    UnicodeSet::~UnicodeSet(&local_e0);
    UnicodeSetIterator::~UnicodeSetIterator(&local_120);
    UnicodeSet::~UnicodeSet(&local_88);
    return;
  }
  pNVar5 = Norms::getNorm(&b1->norms,local_160.codepoint);
  pNVar6 = Norms::getNorm(&b2->norms,UVar2);
  MVar7 = NONE;
  if ((pNVar5 == (Norm *)0x0) || (MVar8 = pNVar5->mappingType, (int)MVar8 < 2)) {
    s1 = (UnicodeString *)0x0;
    MVar8 = NONE;
  }
  else {
    s1 = pNVar5->mapping;
  }
  if (pNVar6 == (Norm *)0x0) {
    s2 = (UnicodeString *)0x0;
  }
  else {
    MVar7 = pNVar6->mappingType;
    if ((int)MVar7 < 2) {
      s2 = (UnicodeString *)0x0;
      MVar7 = NONE;
    }
    else {
      s2 = pNVar6->mapping;
    }
  }
  if (MVar8 == MVar7) goto LAB_001dedc8;
  goto LAB_001dedd4;
LAB_001dedc8:
  bVar4 = anon_unknown_1::equalStrings(s1,s2);
  if (!bVar4) {
LAB_001dedd4:
    if (MVar8 == ONE_WAY) {
      setOneWayMapping(diff,UVar2,s1);
    }
    else if (MVar8 == ROUND_TRIP) {
      setRoundTripMapping(diff,UVar2,s1);
    }
    else if (MVar8 == NONE) {
      removeMapping(diff,UVar2);
    }
  }
  goto LAB_001ded56;
}

Assistant:

void
Normalizer2DataBuilder::computeDiff(const Normalizer2DataBuilder &b1,
                                    const Normalizer2DataBuilder &b2,
                                    Normalizer2DataBuilder &diff) {
    // Compute diff = b1 - b2
    // so that we should be able to get b1 = b2 + diff.
    if(0 != memcmp(b1.unicodeVersion, b2.unicodeVersion, U_MAX_VERSION_LENGTH)) {
        memcpy(diff.unicodeVersion, b1.unicodeVersion, U_MAX_VERSION_LENGTH);
    }

    UnicodeSet ccSet(b1.norms.ccSet);
    ccSet.addAll(b2.norms.ccSet);
    UnicodeSetIterator ccIter(ccSet);
    while(ccIter.next() && !ccIter.isString()) {
        UChar32 c = ccIter.getCodepoint();
        uint8_t cc1 = b1.norms.getCC(c);
        uint8_t cc2 = b2.norms.getCC(c);
        if(cc1 != cc2) {
            diff.setCC(c, cc1);
        }
    }

    UnicodeSet mSet(b1.norms.mappingSet);
    mSet.addAll(b2.norms.mappingSet);
    UnicodeSetIterator mIter(mSet);
    while(mIter.next() && !mIter.isString()) {
        UChar32 c = mIter.getCodepoint();
        const Norm *norm1 = b1.norms.getNorm(c);
        const Norm *norm2 = b2.norms.getNorm(c);
        const UnicodeString *mapping1;
        Norm::MappingType type1;
        if(norm1 == nullptr || !norm1->hasMapping()) {
            mapping1 = nullptr;
            type1 = Norm::NONE;
        } else {
            mapping1 = norm1->mapping;
            type1 = norm1->mappingType;
        }
        const UnicodeString *mapping2;
        Norm::MappingType type2;
        if(norm2 == nullptr || !norm2->hasMapping()) {
            mapping2 = nullptr;
            type2 = Norm::NONE;
        } else {
            mapping2 = norm2->mapping;
            type2 = norm2->mappingType;
        }
        if(type1 == type2 && equalStrings(mapping1, mapping2)) {
            // Nothing to do.
        } else if(type1 == Norm::NONE) {
            diff.removeMapping(c);
        } else if(type1 == Norm::ROUND_TRIP) {
            diff.setRoundTripMapping(c, *mapping1);
        } else if(type1 == Norm::ONE_WAY) {
            diff.setOneWayMapping(c, *mapping1);
        }
    }
}